

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O3

FT_Error cff_ps_get_font_extra(CFF_Face face,PS_FontExtraRec *afont_extra)

{
  byte bVar1;
  uint uVar2;
  void *pvVar3;
  ushort uVar4;
  FT_Error FVar5;
  ushort *puVar6;
  char *pcVar7;
  byte *pbVar8;
  FT_String *s;
  byte *__haystack;
  FT_Error local_2c [2];
  FT_Error error;
  
  pvVar3 = (face->extra).data;
  local_2c[0] = 0;
  if (pvVar3 == (void *)0x0) {
    return 0;
  }
  puVar6 = *(ushort **)((long)pvVar3 + 0x13b8);
  FVar5 = 0;
  if (puVar6 != (ushort *)0x0) goto LAB_001fb102;
  puVar6 = (ushort *)ft_mem_alloc((face->root).memory,2,local_2c);
  if (local_2c[0] != 0) {
    return local_2c[0];
  }
  *puVar6 = 0;
  uVar2 = *(uint *)((long)pvVar3 + 0x748);
  if (uVar2 != 0xffff) {
    if (uVar2 < 0x187) {
      if (*(long *)((long)pvVar3 + 0x1360) != 0) {
        pcVar7 = (char *)(**(code **)(*(long *)((long)pvVar3 + 0x1360) + 0x28))();
        goto LAB_001fb19c;
      }
    }
    else if (uVar2 - 0x187 < *(uint *)((long)pvVar3 + 0x648)) {
      pcVar7 = *(char **)(*(long *)((long)pvVar3 + 0x650) + (ulong)(uVar2 - 0x187) * 8);
LAB_001fb19c:
      if ((pcVar7 != (char *)0x0) && (pcVar7 = strstr(pcVar7,"/FSType"), pcVar7 != (char *)0x0)) {
        __haystack = (byte *)(pcVar7 + 7);
        pbVar8 = (byte *)strstr((char *)__haystack,"def");
        if (__haystack != pbVar8 && pbVar8 != (byte *)0x0) {
          do {
            bVar1 = *__haystack;
            if ((byte)(bVar1 - 0x30) < 10) {
              if (0x1997 < *puVar6) {
LAB_001fb231:
                *puVar6 = 0;
                break;
              }
              uVar4 = *puVar6 * 10;
              *puVar6 = uVar4;
              *puVar6 = (uVar4 + (short)(char)*__haystack) - 0x30;
            }
            else if ((0x20 < bVar1) || ((0x100002400U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
            goto LAB_001fb231;
            __haystack = __haystack + 1;
          } while (__haystack != pbVar8);
        }
      }
    }
  }
  *(ushort **)((long)pvVar3 + 0x13b8) = puVar6;
  FVar5 = local_2c[0];
LAB_001fb102:
  afont_extra->fs_type = *puVar6;
  return FVar5;
}

Assistant:

static FT_Error
  cff_ps_get_font_extra( CFF_Face          face,
                         PS_FontExtraRec*  afont_extra )
  {
    CFF_Font  cff   = (CFF_Font)face->extra.data;
    FT_Error  error = FT_Err_Ok;


    if ( cff && cff->font_extra == NULL )
    {
      CFF_FontRecDict   dict       = &cff->top_font.font_dict;
      PS_FontExtraRec*  font_extra = NULL;
      FT_Memory         memory     = face->root.memory;
      FT_String*        embedded_postscript;


      if ( FT_ALLOC( font_extra, sizeof ( *font_extra ) ) )
        goto Fail;

      font_extra->fs_type = 0U;

      embedded_postscript = cff_index_get_sid_string(
                              cff,
                              dict->embedded_postscript );
      if ( embedded_postscript )
      {
        FT_String*  start_fstype;
        FT_String*  start_def;


        /* Identify the XYZ integer in `/FSType XYZ def' substring. */
        if ( ( start_fstype = ft_strstr( embedded_postscript,
                                         "/FSType" ) ) != NULL    &&
             ( start_def = ft_strstr( start_fstype +
                                        sizeof ( "/FSType" ) - 1,
                                      "def" ) ) != NULL           )
        {
          FT_String*  s;


          for ( s = start_fstype + sizeof ( "/FSType" ) - 1;
                s != start_def;
                s++ )
          {
            if ( *s >= '0' && *s <= '9' )
            {
              if ( font_extra->fs_type >= ( FT_USHORT_MAX - 9 ) / 10 )
              {
                /* Overflow - ignore the FSType value.  */
                font_extra->fs_type = 0U;
                break;
              }

              font_extra->fs_type *= 10;
              font_extra->fs_type += (FT_UShort)( *s - '0' );
            }
            else if ( *s != ' ' && *s != '\n' && *s != '\r' )
            {
              /* Non-whitespace character between `/FSType' and next `def' */
              /* - ignore the FSType value.                                */
              font_extra->fs_type = 0U;
              break;
            }
          }
        }
      }

      cff->font_extra = font_extra;
    }

    if ( cff )
      *afont_extra = *cff->font_extra;

  Fail:
    return error;
  }